

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsMotor::ArchiveOUT(ChShaftsMotor *this,ChArchiveOut *marchive)

{
  eCh_shaftsmotor_mode_mapper mmapper;
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> local_c0;
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> local_a0;
  ChNameValue<double> local_80;
  ChNameValue<double> local_68;
  ChNameValue<double> local_50;
  ChNameValue<chrono::ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsMotor>(marchive);
  ChShaftsMotorBase::ArchiveOUT(&this->super_ChShaftsMotorBase,marchive);
  my_enum_mappers::eCh_shaftsmotor_mode_mapper::eCh_shaftsmotor_mode_mapper
            ((eCh_shaftsmotor_mode_mapper *)&local_a0);
  my_enum_mappers::eCh_shaftsmotor_mode_mapper::operator()
            (&local_c0,(eCh_shaftsmotor_mode_mapper *)&local_a0,&this->motor_mode);
  local_38._name = "motor_mode";
  local_38._flags = '\0';
  local_38._value = &local_c0;
  ChArchiveOut::operator<<(marchive,&local_38);
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>::~ChEnumMapper(&local_c0);
  local_50._value = &this->motor_torque;
  local_50._name = "motor_torque";
  local_50._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_50);
  local_68._value = &this->motor_set_rot;
  local_68._name = "motor_set_rot";
  local_68._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_68);
  local_80._value = &this->motor_set_rot_dt;
  local_80._name = "motor_set_rot_dt";
  local_80._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_80);
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>::~ChEnumMapper(&local_a0);
  return;
}

Assistant:

void ChShaftsMotor::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsMotor>();

    // serialize parent class
    ChShaftsMotorBase::ArchiveOUT(marchive);

    // serialize all member data:
    my_enum_mappers::eCh_shaftsmotor_mode_mapper mmapper;
    marchive << CHNVP(mmapper(motor_mode), "motor_mode");
    marchive << CHNVP(motor_torque);
    marchive << CHNVP(motor_set_rot);
    marchive << CHNVP(motor_set_rot_dt);
}